

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opj_getopt.c
# Opt level: O1

int opj_getopt(int nargc,char **nargv,char *ostr)

{
  char *pcVar1;
  char cVar2;
  char *pcVar3;
  long lVar4;
  uint __c;
  
  if ((opj_optreset == 0) && (*opj_getopt::place != '\0')) {
LAB_00110364:
    pcVar1 = opj_getopt::place + 1;
    cVar2 = *opj_getopt::place;
    __c = (uint)cVar2;
    opj_getopt::place = pcVar1;
    opj_optopt = __c;
    if (__c != 0x3a) {
      pcVar3 = strchr(ostr,__c);
      if (pcVar3 != (char *)0x0) {
        if (pcVar3[1] == ':') {
          if (*pcVar1 == '\0') {
            lVar4 = (long)opj_optind;
            opj_optind = opj_optind + 1;
            if (opj_optind < nargc) {
              pcVar1 = nargv[lVar4 + 1];
            }
            else {
              opj_getopt::place = EMSG;
              if (*ostr == ':') {
                return 0x3a;
              }
              pcVar1 = opj_optarg;
              if (opj_opterr != 0) {
                fprintf(_stderr,"%s: option requires an argument -- %c\n",*nargv,(ulong)__c);
                return 0x3f;
              }
            }
          }
          opj_optarg = pcVar1;
          opj_getopt::place = EMSG;
        }
        else {
          opj_optarg = (char *)0x0;
          if (*pcVar1 != '\0') {
            opj_optarg = (char *)0x0;
            return __c;
          }
        }
        opj_optind = opj_optind + 1;
        return __c;
      }
      if (cVar2 == '-') {
        return -1;
      }
    }
    opj_getopt_cold_1();
    return 0x3f;
  }
  opj_optreset = 0;
  if ((opj_optind < nargc) && (opj_getopt::place = nargv[opj_optind], *opj_getopt::place == '-')) {
    pcVar1 = opj_getopt::place + 1;
    if ((*pcVar1 == '\0') || (opj_getopt::place = opj_getopt::place + 1, *pcVar1 != '-'))
    goto LAB_00110364;
    opj_optind = opj_optind + 1;
  }
  opj_getopt::place = EMSG;
  opj_optreset = 0;
  return -1;
}

Assistant:

int opj_getopt(int nargc, char *const *nargv, const char *ostr)
{
#  define __progname nargv[0]
    static char *place = EMSG;    /* option letter processing */
    const char *oli = NULL;   /* option letter list index */

    if (opj_optreset || !*place) {    /* update scanning pointer */
        opj_optreset = 0;
        if (opj_optind >= nargc || *(place = nargv[opj_optind]) != '-') {
            place = EMSG;
            return (-1);
        }
        if (place[1] && *++place == '-') {  /* found "--" */
            ++opj_optind;
            place = EMSG;
            return (-1);
        }
    }             /* option letter okay? */
    if ((opj_optopt = (int) * place++) == (int) ':' ||
            !(oli = strchr(ostr, opj_optopt))) {
        /*
         * if the user didn't specify '-' as an option,
         * assume it means -1.
         */
        if (opj_optopt == (int) '-') {
            return (-1);
        }
        if (!*place) {
            ++opj_optind;
        }
        if (opj_opterr && *ostr != ':') {
            fprintf(stderr,
                    "%s: illegal option -- %c\n", __progname, opj_optopt);
            return (BADCH);
        }
    }
    if (*++oli != ':') {      /* don't need argument */
        opj_optarg = NULL;
        if (!*place) {
            ++opj_optind;
        }
    } else {          /* need an argument */
        if (*place) {       /* no white space */
            opj_optarg = place;
        } else if (nargc <= ++opj_optind) { /* no arg */
            place = EMSG;
            if (*ostr == ':') {
                return (BADARG);
            }
            if (opj_opterr) {
                fprintf(stderr,
                        "%s: option requires an argument -- %c\n",
                        __progname, opj_optopt);
                return (BADCH);
            }
        } else {        /* white space */
            opj_optarg = nargv[opj_optind];
        }
        place = EMSG;
        ++opj_optind;
    }
    return (opj_optopt);      /* dump back option letter */
}